

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConcaveCollisionAlgorithm.cpp
# Opt level: O1

btScalar __thiscall
btConvexConcaveCollisionAlgorithm::calculateTimeOfImpact
          (btConvexConcaveCollisionAlgorithm *this,btCollisionObject *body0,btCollisionObject *body1
          ,btDispatcherInfo *dispatchInfo,btManifoldResult *resultOut)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  btCollisionShape *pbVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [16];
  btCollisionObject *pbVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  btTransform triInv;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  undefined4 uStack_2ac;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  undefined4 uStack_29c;
  undefined1 local_298 [16];
  float local_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  float local_1b8;
  float local_1b4;
  float local_1b0;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  float local_198;
  float local_194;
  float local_190;
  undefined8 local_188;
  float local_180;
  btTriangleCallback local_178;
  undefined8 local_170;
  float local_168;
  undefined4 local_164;
  undefined8 local_160;
  float local_158;
  undefined4 local_154;
  undefined8 local_150;
  float local_148;
  undefined4 local_144;
  undefined8 local_140;
  ulong uStack_138;
  undefined8 local_130;
  float local_128;
  undefined4 local_124;
  undefined8 local_120;
  float local_118;
  undefined4 local_114;
  undefined8 local_110;
  float local_108;
  undefined4 local_104;
  undefined1 local_100 [16];
  float local_b0;
  btScalar local_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  pbVar10 = body0;
  if (this->m_isSwapped != false) {
    pbVar10 = body1;
  }
  fVar11 = (pbVar10->m_interpolationWorldTransform).m_origin.m_floats[0] -
           (pbVar10->m_worldTransform).m_origin.m_floats[0];
  fVar15 = (pbVar10->m_interpolationWorldTransform).m_origin.m_floats[1] -
           (pbVar10->m_worldTransform).m_origin.m_floats[1];
  fVar18 = (pbVar10->m_interpolationWorldTransform).m_origin.m_floats[2] -
           (pbVar10->m_worldTransform).m_origin.m_floats[2];
  if (pbVar10->m_ccdMotionThreshold * pbVar10->m_ccdMotionThreshold <=
      fVar18 * fVar18 + fVar11 * fVar11 + fVar15 * fVar15) {
    if (this->m_isSwapped != false) {
      body1 = body0;
    }
    btTransform::inverse(&body1->m_worldTransform);
    if (8 < body1->m_collisionShape->m_shapeType - 0x15U) {
      return 1.0;
    }
    fVar11 = (pbVar10->m_worldTransform).m_origin.m_floats[0];
    fVar15 = (pbVar10->m_worldTransform).m_origin.m_floats[1];
    fVar18 = (pbVar10->m_worldTransform).m_origin.m_floats[2];
    local_58._8_4_ = fVar18 * local_190 + fVar11 * local_198 + local_194 * fVar15 + local_180;
    fVar19 = (pbVar10->m_interpolationWorldTransform).m_origin.m_floats[0];
    fVar20 = (pbVar10->m_interpolationWorldTransform).m_origin.m_floats[1];
    fVar24 = (pbVar10->m_interpolationWorldTransform).m_origin.m_floats[2];
    local_1e8 = ZEXT416((uint)local_198);
    local_1d8 = ZEXT416((uint)local_190);
    local_1f8 = ZEXT416((uint)local_1b4);
    fVar17 = (float)((ulong)local_188 >> 0x20);
    fVar12 = fVar18 * local_1b0 + fVar11 * local_1b8 + fVar15 * local_1b4 + (float)local_188;
    fVar13 = fVar18 * local_1a0 + fVar11 * local_1a8 + fVar15 * local_1a4 + fVar17;
    uVar3 = *(undefined8 *)(pbVar10->m_worldTransform).m_basis.m_el[0].m_floats;
    fVar14 = (float)uVar3;
    fVar23 = (float)((ulong)uVar3 >> 0x20);
    uVar3 = *(undefined8 *)(pbVar10->m_worldTransform).m_basis.m_el[1].m_floats;
    local_78 = (float)uVar3;
    fStack_74 = (float)((ulong)uVar3 >> 0x20);
    fVar16 = fVar24 * local_1b0 + fVar19 * local_1b8 + fVar20 * local_1b4 + (float)local_188;
    fVar17 = fVar24 * local_1a0 + fVar19 * local_1a8 + fVar20 * local_1a4 + fVar17;
    uVar3 = *(undefined8 *)(pbVar10->m_worldTransform).m_basis.m_el[2].m_floats;
    fVar11 = (pbVar10->m_worldTransform).m_basis.m_el[0].m_floats[2];
    fVar15 = (pbVar10->m_worldTransform).m_basis.m_el[1].m_floats[2];
    fVar18 = (pbVar10->m_worldTransform).m_basis.m_el[2].m_floats[2];
    uVar4 = *(undefined8 *)(pbVar10->m_interpolationWorldTransform).m_basis.m_el[0].m_floats;
    uVar5 = *(undefined8 *)(pbVar10->m_interpolationWorldTransform).m_basis.m_el[1].m_floats;
    fVar21 = (float)uVar5;
    fVar22 = (float)((ulong)uVar5 >> 0x20);
    uVar5 = *(undefined8 *)(pbVar10->m_interpolationWorldTransform).m_basis.m_el[2].m_floats;
    uStack_40 = 0;
    fVar1 = (pbVar10->m_interpolationWorldTransform).m_basis.m_el[0].m_floats[2];
    local_27c = (pbVar10->m_interpolationWorldTransform).m_basis.m_el[1].m_floats[2];
    fVar2 = (pbVar10->m_interpolationWorldTransform).m_basis.m_el[2].m_floats[2];
    auVar7._4_4_ = fVar13;
    auVar7._0_4_ = fVar12;
    auVar7._8_4_ = local_58._8_4_;
    if (fVar16 < fVar12) {
      auVar7._4_8_ = auVar7._4_8_;
      auVar7._0_4_ = fVar16;
    }
    local_180 = local_180 + fVar24 * local_190 + fVar19 * local_198 + local_194 * fVar20;
    local_2a8._4_4_ = auVar7._4_4_;
    if (fVar17 < (float)local_2a8._4_4_) {
      local_2a8._0_4_ = auVar7._0_4_;
      local_2a8._4_4_ = fVar17;
      auVar7._8_4_ = auVar7._8_4_;
      auVar7._0_8_ = local_2a8;
    }
    fStack_2a0 = auVar7._8_4_;
    if (local_180 < fStack_2a0) {
      local_2a8 = auVar7._0_8_;
      fStack_2a0 = local_180;
      auVar7 = _local_2a8;
    }
    local_28 = ZEXT416((uint)local_180);
    uStack_60 = 0;
    local_1c8 = ZEXT416((uint)local_1a0);
    auVar8._4_4_ = fVar13;
    auVar8._0_4_ = fVar12;
    auVar8._8_4_ = local_58._8_4_;
    if (fVar12 < fVar16) {
      auVar8._4_8_ = auVar8._4_8_;
      auVar8._0_4_ = fVar16;
    }
    local_140 = CONCAT44(fVar13,fVar12);
    auVar9._8_4_ = local_58._8_4_;
    auVar9._0_8_ = local_140;
    auVar9._12_4_ = 0;
    local_88 = local_1b4 * local_78;
    fStack_84 = local_1b4 * fStack_74;
    fStack_80 = local_1b4 * 0.0;
    fStack_7c = local_1b4 * 0.0;
    local_38 = ZEXT416((uint)local_1b0);
    local_98 = local_1b4 * fVar15;
    uStack_94 = 0;
    uStack_90 = 0;
    uStack_8c = 0;
    local_a8 = local_78 * local_1a4;
    fStack_a4 = fStack_74 * local_1a4;
    fStack_a0 = local_1a4 * 0.0;
    fStack_9c = local_1a4 * 0.0;
    local_78 = local_78 * local_194;
    fStack_74 = fStack_74 * local_194;
    fStack_70 = local_194 * 0.0;
    fStack_6c = local_194 * 0.0;
    local_268 = (float)uVar4;
    fStack_264 = (float)((ulong)uVar4 >> 0x20);
    fVar19 = local_1b8 * local_268;
    fVar20 = local_1b8 * fStack_264;
    fVar24 = local_1a8 * local_268;
    fVar12 = local_1a8 * fStack_264;
    local_218 = ZEXT416((uint)(local_1a4 * local_27c));
    local_258 = ZEXT416((uint)(local_194 * local_27c));
    local_208 = ZEXT416((uint)(local_1b8 * fVar1));
    local_2b8._4_4_ = auVar8._4_4_;
    if ((float)local_2b8._4_4_ < fVar17) {
      local_2b8._0_4_ = auVar8._0_4_;
      local_2b8._4_4_ = fVar17;
      auVar8._8_4_ = auVar8._8_4_;
      auVar8._0_8_ = local_2b8;
    }
    local_238 = fVar14 * local_1b8 + local_88;
    fStack_234 = fVar23 * local_1b8 + fStack_84;
    fStack_230 = local_1b8 * 0.0 + fStack_80;
    fStack_22c = local_1b8 * 0.0 + fStack_7c;
    local_248 = fVar14 * local_1a8 + local_a8;
    fStack_244 = fVar23 * local_1a8 + fStack_a4;
    fStack_240 = local_1a8 * 0.0 + fStack_a0;
    fStack_23c = local_1a8 * 0.0 + fStack_9c;
    local_228 = fVar14 * local_198 + local_78;
    fStack_224 = fVar23 * local_198 + fStack_74;
    fStack_220 = local_198 * 0.0 + fStack_70;
    fStack_21c = local_198 * 0.0 + fStack_6c;
    local_118 = local_1a8 * fVar1 + local_1a4 * local_27c;
    local_298 = ZEXT416((uint)local_118);
    local_68._0_4_ = (float)uVar3;
    local_68._4_4_ = (float)((ulong)uVar3 >> 0x20);
    fVar13 = local_268 * local_198 + local_194 * fVar21;
    fVar14 = fStack_264 * local_198 + local_194 * fVar22;
    _local_268 = CONCAT44(fVar14,fVar13);
    _fStack_260 = CONCAT44(local_198 * 0.0 + local_194 * 0.0,local_198 * 0.0 + local_194 * 0.0);
    local_48._0_4_ = (float)uVar5;
    local_48._4_4_ = (float)((ulong)uVar5 >> 0x20);
    fStack_2b0 = auVar8._8_4_;
    if (fStack_2b0 < local_180) {
      local_2b8 = auVar8._0_8_;
      fStack_2b0 = local_180;
      auVar8 = _local_2b8;
    }
    local_168 = fVar18 * local_1b0 + fVar11 * local_1b8 + local_98;
    local_158 = fVar18 * local_1a0 + fVar11 * local_1a8 + fVar15 * local_1a4;
    local_148 = fVar18 * local_190 + fVar11 * local_198 + fVar15 * local_194;
    local_278 = local_1b0 * (float)local_48 + fVar19 + local_1b4 * fVar21;
    fStack_274 = local_1b0 * local_48._4_4_ + fVar20 + local_1b4 * fVar22;
    fStack_270 = local_1b0 * 0.0 + local_1b8 * 0.0 + local_1b4 * 0.0;
    fStack_26c = local_1b0 * 0.0 + local_1b8 * 0.0 + local_1b4 * 0.0;
    local_128 = local_1b0 * fVar2 + local_1b8 * fVar1 + local_1b4 * local_27c;
    local_118 = local_1a0 * fVar2 + local_118;
    local_108 = fVar2 * local_190 + fVar1 * local_198 + local_194 * local_27c;
    local_58._12_4_ = 0;
    local_b0 = pbVar10->m_ccdSweptSphereRadius;
    local_2a8._4_4_ = auVar7._4_4_ - local_b0;
    local_2a8._0_4_ = auVar7._0_4_ - local_b0;
    fStack_2a0 = auVar7._8_4_;
    fStack_2a0 = fStack_2a0 - local_b0;
    uStack_29c = 0;
    local_2b8._4_4_ = auVar8._4_4_ + local_b0;
    local_2b8._0_4_ = auVar8._0_4_ + local_b0;
    fStack_2b0 = auVar8._8_4_ + local_b0;
    uStack_2ac = 0;
    local_178._vptr_btTriangleCallback = (_func_int **)&PTR__btTriangleCallback_002240d0;
    local_170 = CONCAT44(local_68._4_4_ * local_1b0 + fStack_234,
                         (float)local_68 * local_1b0 + local_238);
    local_164 = 0;
    local_160 = CONCAT44(local_68._4_4_ * local_1a0 + fStack_244,
                         (float)local_68 * local_1a0 + local_248);
    local_154 = 0;
    local_150 = CONCAT44(local_68._4_4_ * local_190 + fStack_224,
                         (float)local_68 * local_190 + local_228);
    local_144 = 0;
    uStack_138 = local_58._8_8_;
    local_130 = CONCAT44(fStack_274,local_278);
    local_124 = 0;
    local_120 = CONCAT44(local_1a0 * local_48._4_4_ + fVar12 + local_1a4 * fVar22,
                         local_1a0 * (float)local_48 + fVar24 + local_1a4 * fVar21);
    local_114 = 0;
    local_110 = CONCAT44(local_48._4_4_ * local_190 + fVar14,(float)local_48 * local_190 + fVar13);
    local_104 = 0;
    local_100._4_4_ = fVar17;
    local_100._0_4_ = fVar16;
    local_100._8_4_ = local_180;
    local_100._12_4_ = 0;
    local_ac = pbVar10->m_hitFraction;
    pbVar6 = body1->m_collisionShape;
    local_68 = uVar3;
    local_58 = auVar9;
    local_48 = uVar5;
    if (pbVar6 != (btCollisionShape *)0x0) {
      (*pbVar6->_vptr_btCollisionShape[0x10])(pbVar6,&local_178,local_2a8,local_2b8);
    }
    if (local_ac < pbVar10->m_hitFraction) {
      pbVar10->m_hitFraction = local_ac;
      local_298._0_4_ = local_ac;
      btTriangleCallback::~btTriangleCallback(&local_178);
      return (btScalar)local_298._0_4_;
    }
    btTriangleCallback::~btTriangleCallback(&local_178);
  }
  return 1.0;
}

Assistant:

btScalar btConvexConcaveCollisionAlgorithm::calculateTimeOfImpact(btCollisionObject* body0,btCollisionObject* body1,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	(void)resultOut;
	(void)dispatchInfo;
	btCollisionObject* convexbody = m_isSwapped ? body1 : body0;
	btCollisionObject* triBody = m_isSwapped ? body0 : body1;


	//quick approximation using raycast, todo: hook up to the continuous collision detection (one of the btConvexCast)

	//only perform CCD above a certain threshold, this prevents blocking on the long run
	//because object in a blocked ccd state (hitfraction<1) get their linear velocity halved each frame...
	btScalar squareMot0 = (convexbody->getInterpolationWorldTransform().getOrigin() - convexbody->getWorldTransform().getOrigin()).length2();
	if (squareMot0 < convexbody->getCcdSquareMotionThreshold())
	{
		return btScalar(1.);
	}

	//const btVector3& from = convexbody->m_worldTransform.getOrigin();
	//btVector3 to = convexbody->m_interpolationWorldTransform.getOrigin();
	//todo: only do if the motion exceeds the 'radius'

	btTransform triInv = triBody->getWorldTransform().inverse();
	btTransform convexFromLocal = triInv * convexbody->getWorldTransform();
	btTransform convexToLocal = triInv * convexbody->getInterpolationWorldTransform();

	struct LocalTriangleSphereCastCallback	: public btTriangleCallback
	{
		btTransform m_ccdSphereFromTrans;
		btTransform m_ccdSphereToTrans;
		btTransform	m_meshTransform;

		btScalar	m_ccdSphereRadius;
		btScalar	m_hitFraction;
	

		LocalTriangleSphereCastCallback(const btTransform& from,const btTransform& to,btScalar ccdSphereRadius,btScalar hitFraction)
			:m_ccdSphereFromTrans(from),
			m_ccdSphereToTrans(to),
			m_ccdSphereRadius(ccdSphereRadius),
			m_hitFraction(hitFraction)
		{			
		}
		
		
		virtual void processTriangle(btVector3* triangle, int partId, int triangleIndex)
		{
			(void)partId;
			(void)triangleIndex;
			//do a swept sphere for now
			btTransform ident;
			ident.setIdentity();
			btConvexCast::CastResult castResult;
			castResult.m_fraction = m_hitFraction;
			btSphereShape	pointShape(m_ccdSphereRadius);
			btTriangleShape	triShape(triangle[0],triangle[1],triangle[2]);
			btVoronoiSimplexSolver	simplexSolver;
			btSubsimplexConvexCast convexCaster(&pointShape,&triShape,&simplexSolver);
			//GjkConvexCast	convexCaster(&pointShape,convexShape,&simplexSolver);
			//ContinuousConvexCollision convexCaster(&pointShape,convexShape,&simplexSolver,0);
			//local space?

			if (convexCaster.calcTimeOfImpact(m_ccdSphereFromTrans,m_ccdSphereToTrans,
				ident,ident,castResult))
			{
				if (m_hitFraction > castResult.m_fraction)
					m_hitFraction = castResult.m_fraction;
			}

		}

	};


	

	
	if (triBody->getCollisionShape()->isConcave())
	{
		btVector3 rayAabbMin = convexFromLocal.getOrigin();
		rayAabbMin.setMin(convexToLocal.getOrigin());
		btVector3 rayAabbMax = convexFromLocal.getOrigin();
		rayAabbMax.setMax(convexToLocal.getOrigin());
		btScalar ccdRadius0 = convexbody->getCcdSweptSphereRadius();
		rayAabbMin -= btVector3(ccdRadius0,ccdRadius0,ccdRadius0);
		rayAabbMax += btVector3(ccdRadius0,ccdRadius0,ccdRadius0);

		btScalar curHitFraction = btScalar(1.); //is this available?
		LocalTriangleSphereCastCallback raycastCallback(convexFromLocal,convexToLocal,
			convexbody->getCcdSweptSphereRadius(),curHitFraction);

		raycastCallback.m_hitFraction = convexbody->getHitFraction();

		btCollisionObject* concavebody = triBody;

		btConcaveShape* triangleMesh = (btConcaveShape*) concavebody->getCollisionShape();
		
		if (triangleMesh)
		{
			triangleMesh->processAllTriangles(&raycastCallback,rayAabbMin,rayAabbMax);
		}
	


		if (raycastCallback.m_hitFraction < convexbody->getHitFraction())
		{
			convexbody->setHitFraction( raycastCallback.m_hitFraction);
			return raycastCallback.m_hitFraction;
		}
	}

	return btScalar(1.);

}